

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

VertexWeightTable * Assimp::ComputeVertexBoneWeightTable(aiMesh *pMesh)

{
  uint uVar1;
  aiBone *paVar2;
  aiVertexWeight *paVar3;
  ulong *puVar4;
  uint a;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  VertexWeightTable *__s;
  pair<unsigned_int,_float> local_38;
  
  if (((pMesh == (aiMesh *)0x0) || (uVar1 = pMesh->mNumVertices, uVar1 == 0)) ||
     (uVar5 = pMesh->mNumBones, uVar5 == 0)) {
    __s = (VertexWeightTable *)0x0;
  }
  else {
    lVar8 = (ulong)uVar1 * 0x18;
    puVar4 = (ulong *)operator_new__(lVar8 + 8);
    *puVar4 = (ulong)uVar1;
    __s = (VertexWeightTable *)(puVar4 + 1);
    memset(__s,0,lVar8 - (lVar8 - 0x18U) % 0x18);
    for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      paVar2 = pMesh->mBones[uVar7];
      for (uVar6 = 0; uVar6 < paVar2->mNumWeights; uVar6 = uVar6 + 1) {
        paVar3 = paVar2->mWeights;
        local_38.second = paVar3[uVar6].mWeight;
        local_38.first = (uint)uVar7;
        std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
        emplace_back<std::pair<unsigned_int,float>>
                  ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    *)(__s + paVar3[uVar6].mVertexId),&local_38);
      }
      uVar5 = pMesh->mNumBones;
    }
  }
  return __s;
}

Assistant:

VertexWeightTable* ComputeVertexBoneWeightTable(const aiMesh* pMesh)
{
    if (!pMesh || !pMesh->mNumVertices || !pMesh->mNumBones) {
        return NULL;
    }

    VertexWeightTable* avPerVertexWeights = new VertexWeightTable[pMesh->mNumVertices];
    for (unsigned int i = 0; i < pMesh->mNumBones;++i)  {

        aiBone* bone = pMesh->mBones[i];
        for (unsigned int a = 0; a < bone->mNumWeights;++a) {
            const aiVertexWeight& weight = bone->mWeights[a];
            avPerVertexWeights[weight.mVertexId].push_back( std::pair<unsigned int,float>(i,weight.mWeight) );
        }
    }
    return avPerVertexWeights;
}